

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::MapFieldGenerator::GenerateSerializationCode
          (MapFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null) {\n  com.google.protobuf.nano.InternalNano.serializeMapField(\n    output, this.$name$, $number$,\n  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n  com.google.protobuf.nano.InternalNano.$value_desc_type$);\n}\n"
                    );
  return;
}

Assistant:

void MapFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null) {\n"
    "  com.google.protobuf.nano.InternalNano.serializeMapField(\n"
    "    output, this.$name$, $number$,\n"
    "  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n"
    "  com.google.protobuf.nano.InternalNano.$value_desc_type$);\n"
    "}\n");
}